

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMesh(OgreBinarySerializer *this,Mesh *mesh)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  SubMesh *this_00;
  Logger *pLVar4;
  uint8_t *puVar5;
  MemoryIOStream *__p;
  ostream *poVar6;
  VertexData *this_01;
  DeadlyImportError *this_02;
  char *pcVar7;
  OgreBinarySerializer *this_03;
  string *this_04;
  ulong numBytes;
  char *local_1d0 [4];
  SubMesh *submesh;
  undefined1 local_1a8 [376];
  
  this_00 = (SubMesh *)operator_new(0xa8);
  SubMesh::SubMesh(this_00);
  submesh = this_00;
  ReadLine_abi_cxx11_((string *)local_1a8,this);
  this_04 = &(this_00->super_ISubMesh).materialRef;
  std::__cxx11::string::operator=((string *)this_04,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  bVar1 = Read<bool>(this);
  (this_00->super_ISubMesh).usesSharedVertexData = bVar1;
  uVar3 = Read<unsigned_int>(this);
  this_00->indexData->count = uVar3;
  this_00->indexData->faceCount = this_00->indexData->count / 3;
  bVar1 = Read<bool>(this);
  this_00->indexData->is32bit = bVar1;
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[17]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [17])"Reading SubMesh ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar4,local_1d0[0]);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[16]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [16])"  - Material: \'");
  std::operator<<((ostream *)local_1a8,(string *)this_04);
  std::operator<<((ostream *)local_1a8,"\'");
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar4,local_1d0[0]);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [27])"  - Uses shared geometry: ");
  pcVar7 = "false";
  if ((this_00->super_ISubMesh).usesSharedVertexData != false) {
    pcVar7 = "true";
  }
  std::operator<<((ostream *)local_1a8,pcVar7);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar4,local_1d0[0]);
  std::__cxx11::string::~string((string *)local_1d0);
  this_03 = (OgreBinarySerializer *)local_1a8;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_03);
  uVar3 = this_00->indexData->count;
  if (uVar3 != 0) {
    numBytes = (ulong)(uVar3 << (this_00->indexData->is32bit + 1U & 0x1f));
    puVar5 = ReadBytes(this,numBytes);
    __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_0080bab0;
    __p->buffer = puVar5;
    __p->length = numBytes;
    __p->pos = 0;
    __p->own = true;
    std::__shared_ptr<Assimp::MemoryIOStream,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Assimp::MemoryIOStream,void>
              ((__shared_ptr<Assimp::MemoryIOStream,(__gnu_cxx::_Lock_policy)2> *)local_1a8,__p);
    std::__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this_00->indexData->buffer).
                super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2> *)local_1a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8));
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [5])"  - ");
    poVar6 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_1a8,&this_00->indexData->faceCount);
    std::operator<<(poVar6," faces from ");
    poVar6 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar6,
                        &this_00->indexData->count);
    pcVar7 = " 16bit";
    if (this_00->indexData->is32bit != false) {
      pcVar7 = " 32bit";
    }
    std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6," indexes of ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6," bytes");
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar4,local_1d0[0]);
    std::__cxx11::string::~string((string *)local_1d0);
    this_03 = (OgreBinarySerializer *)local_1a8;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_03);
  }
  if ((this_00->super_ISubMesh).usesSharedVertexData == false) {
    uVar2 = ReadHeader(this,true);
    if (uVar2 != 0x5000) {
      this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,
                 "M_SUBMESH does not contain M_GEOMETRY, but shader geometry is set to false",
                 (allocator<char> *)local_1d0);
      DeadlyImportError::DeadlyImportError(this_02,(string *)local_1a8);
      __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = (VertexData *)operator_new(200);
    VertexData::VertexData(this_01);
    this_00->vertexData = this_01;
    this_03 = this;
    ReadGeometry(this,this_01);
  }
  if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
LAB_00444a69:
    NormalizeBoneWeights(this_03,this_00->vertexData);
    (this_00->super_ISubMesh).index =
         (uint)((ulong)((long)(mesh->subMeshes).
                              super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(mesh->subMeshes).
                             super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::push_back
              (&mesh->subMeshes,&submesh);
    return;
  }
  do {
    this_03 = this;
    uVar2 = ReadHeader(this,true);
    do {
      if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) goto LAB_00444a69;
      if (uVar2 == 0x4200) {
        this_03 = this;
        ReadSubMeshTextureAlias(this,this_00);
      }
      else if (uVar2 == 0x4100) {
        this_03 = this;
        ReadBoneAssignment(this,this_00->vertexData);
      }
      else {
        if (uVar2 != 0x4010) {
          RollbackHeader(this);
          this_03 = this;
          goto LAB_00444a69;
        }
        this_03 = this;
        ReadSubMeshOperation(this,this_00);
      }
    } while (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current);
  } while( true );
}

Assistant:

void OgreBinarySerializer::ReadSubMesh(Mesh *mesh)
{
    uint16_t id = 0;

    SubMesh *submesh = new SubMesh();
    submesh->materialRef = ReadLine();
    submesh->usesSharedVertexData = Read<bool>();

    submesh->indexData->count = Read<uint32_t>();
    submesh->indexData->faceCount = static_cast<uint32_t>(submesh->indexData->count / 3);
    submesh->indexData->is32bit = Read<bool>();

    ASSIMP_LOG_DEBUG_F( "Reading SubMesh ", mesh->subMeshes.size());
    ASSIMP_LOG_DEBUG_F( "  - Material: '", submesh->materialRef, "'");
    ASSIMP_LOG_DEBUG_F( "  - Uses shared geometry: ", submesh->usesSharedVertexData ? "true" : "false" );

    // Index buffer
    if (submesh->indexData->count > 0)
    {
        uint32_t numBytes = submesh->indexData->count * (submesh->indexData->is32bit ? sizeof(uint32_t) : sizeof(uint16_t));
        uint8_t *indexBuffer = ReadBytes(numBytes);
        submesh->indexData->buffer = MemoryStreamPtr(new Assimp::MemoryIOStream(indexBuffer, numBytes, true));

        ASSIMP_LOG_DEBUG_F( "  - ", submesh->indexData->faceCount,
            " faces from ", submesh->indexData->count, (submesh->indexData->is32bit ? " 32bit" : " 16bit"),
            " indexes of ", numBytes, " bytes");
    }

    // Vertex buffer if not referencing the shared geometry
    if (!submesh->usesSharedVertexData)
    {
        id = ReadHeader();
        if (id != M_GEOMETRY) {
            throw DeadlyImportError("M_SUBMESH does not contain M_GEOMETRY, but shader geometry is set to false");
        }

        submesh->vertexData = new VertexData();
        ReadGeometry(submesh->vertexData);
    }

    // Bone assignment, submesh operation and texture aliases
    if (!AtEnd())
    {
        id = ReadHeader();
        while (!AtEnd() &&
            (id == M_SUBMESH_OPERATION ||
             id == M_SUBMESH_BONE_ASSIGNMENT ||
             id == M_SUBMESH_TEXTURE_ALIAS))
        {
            switch(id)
            {
                case M_SUBMESH_OPERATION:
                {
                    ReadSubMeshOperation(submesh);
                    break;
                }
                case M_SUBMESH_BONE_ASSIGNMENT:
                {
                    ReadBoneAssignment(submesh->vertexData);
                    break;
                }
                case M_SUBMESH_TEXTURE_ALIAS:
                {
                    ReadSubMeshTextureAlias(submesh);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    NormalizeBoneWeights(submesh->vertexData);

    submesh->index = static_cast<unsigned int>(mesh->subMeshes.size());
    mesh->subMeshes.push_back(submesh);
}